

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcQueueHelper.cpp
# Opt level: O0

int __thiscall
helics::ipc::SendToQueue::connect(SendToQueue *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  queue_state_t qVar2;
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  interprocess_exception *ipe;
  void *in_stack_00000098;
  size_t in_stack_000000a0;
  offset_t in_stack_000000a8;
  mode_t in_stack_000000b4;
  interprocess_exception *anon_var_0;
  mapped_region *in_stack_000000c0;
  SharedQueueState *sstate;
  mapped_region region;
  __single_object queue_state;
  int tries;
  bool goodToConnect;
  string stateName;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  *in_stack_fffffffffffffe70;
  SharedQueueState *this_00;
  char **in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  int local_e4;
  duration<long,std::ratio<1l,1000l>> local_e0 [8];
  unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  *local_d8;
  mapped_region local_d0;
  undefined4 local_ac;
  char *local_a8;
  int local_98;
  byte local_91;
  SharedQueueState local_60;
  socklen_t local_20;
  byte local_19;
  undefined8 local_18;
  SendToQueue *local_10;
  byte local_1;
  
  local_18 = CONCAT44(in_register_00000034,__fd);
  local_19 = (byte)__addr & 1;
  local_20 = __len;
  local_10 = this;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_fffffffffffffe60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  this_00 = &local_60;
  std::__cxx11::string::string(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  stringTranslateToCppName((string *)this_00);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::__cxx11::string::~string(in_stack_fffffffffffffe60);
  std::__cxx11::string::~string(in_stack_fffffffffffffe60);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (char *)this);
  local_91 = 0;
  local_98 = 0;
  do {
    if (((local_91 ^ 0xff) & 1) == 0) goto LAB_0049e2b9;
    local_a8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x49df44
                      );
    local_ac = 2;
    std::
    make_unique<boost::interprocess::shared_memory_object,boost::interprocess::open_only_t_const&,char_const*,boost::interprocess::mode_t>
              ((open_only_t *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,(mode_t *)this_00)
    ;
    std::
    unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
    ::operator*((unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
                 *)in_stack_fffffffffffffe60);
    in_stack_fffffffffffffe58 = 0xffffffff;
    boost::interprocess::mapped_region::mapped_region<boost::interprocess::shared_memory_object>
              (in_stack_000000c0,(shared_memory_object *)anon_var_0,in_stack_000000b4,
               in_stack_000000a8,in_stack_000000a0,in_stack_00000098,(map_options_t)sstate);
    in_stack_fffffffffffffe70 =
         (unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
          *)boost::interprocess::mapped_region::get_address(&local_d0);
    local_d8 = in_stack_fffffffffffffe70;
    qVar2 = SharedQueueState::getState(this_00);
    if (qVar2 != unknown) {
      if ((uint)qVar2 < 2) {
        local_91 = 1;
      }
      else if ((qVar2 == operating) && ((local_19 & 1) == 0)) {
        local_91 = 1;
      }
    }
    if ((local_91 & 1) == 0) {
      local_98 = local_98 + 1;
      if (local_98 <= (int)local_20) {
        std::
        unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
        ::reset((unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
                 *)in_stack_fffffffffffffe60,
                (pointer)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        local_e4 = 200;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_e0,&local_e4);
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffea0);
        goto LAB_0049e163;
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_fffffffffffffe60,
                (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      local_1 = 0;
      bVar1 = true;
    }
    else {
LAB_0049e163:
      bVar1 = false;
    }
    boost::interprocess::mapped_region::~mapped_region((mapped_region *)0x49e17b);
    std::
    unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
    ::~unique_ptr((unique_ptr<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
                   *)in_stack_fffffffffffffe60);
  } while (!bVar1);
LAB_0049e4fa:
  std::__cxx11::string::~string(in_stack_fffffffffffffe60);
  return (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),local_1) & 0xffffff01;
LAB_0049e2b9:
  while (((this->connected ^ 0xffU) & 1) != 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x49e2dd);
    std::
    make_unique<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>>,boost::interprocess::open_only_t_const&,char_const*>
              ((open_only_t *)this_00,(char **)this);
    std::
    unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
    ::operator=((unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                 *)in_stack_fffffffffffffe60,
                (unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    std::
    unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
    ::~unique_ptr(in_stack_fffffffffffffe70);
    this->connected = true;
  }
  local_1 = this->connected & 1;
  goto LAB_0049e4fa;
}

Assistant:

bool SendToQueue::connect(const std::string& connection, bool initOnly, int retries)
    {
        connectionNameOrig = connection;
        connectionName = stringTranslateToCppName(connection);
        std::string stateName = connectionName + "_state";
        bool goodToConnect = false;
        int tries = 0;
        while (!goodToConnect) {
            try {
                auto queue_state = std::make_unique<ipc_state>(boostipc::open_only,
                                                               stateName.c_str(),
                                                               boostipc::read_write);
                boostipc::mapped_region region(*queue_state, boostipc::read_write);

                auto* sstate = reinterpret_cast<SharedQueueState*>(region.get_address());

                switch (sstate->getState()) {
                    case queue_state_t::connected:
                    case queue_state_t::startup:
                        goodToConnect = true;
                        break;
                    case queue_state_t::operating:
                        if (!initOnly) {
                            goodToConnect = true;
                        }
                        break;
                    case queue_state_t::unknown:  // probably still undergoing setup
                    default:
                        break;
                }
                if (!goodToConnect) {
                    ++tries;
                    if (tries <= retries) {
                        queue_state.reset();
                        std::this_thread::sleep_for(std::chrono::milliseconds(200));
                    } else {
                        errorString = "timed out waiting for the queue to become available";
                        return false;
                    }
                }
            }

            catch (boost::interprocess::interprocess_exception const&) {
                // this likely means the shared_memory_object doesn't exist yet
                ++tries;
                if (tries <= retries) {
                    std::this_thread::sleep_for(std::chrono::milliseconds(200));
                } else {
                    errorString = "timed out waiting for the queue to become available";
                    return false;
                }
            }
        }

        while (!connected) {
            try {
                txqueue = std::make_unique<ipc_queue>(boostipc::open_only, connectionName.c_str());
                connected = true;
            }
            catch (boost::interprocess::interprocess_exception const& ipe) {
                // this likely means the shared file doesn't exist yet
                ++tries;
                if (tries <= retries) {
                    std::this_thread::sleep_for(std::chrono::milliseconds(200));
                } else {
                    errorString = std::string("Unable to open connection:") + ipe.what();
                    break;
                }
            }
        }
        return connected;
    }